

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O0

Storyboard * __thiscall
ApprovalTests::Storyboard::addDescriptionWithData(Storyboard *this,string *description,string *data)

{
  ostream *poVar1;
  string *in_RDX;
  string *in_RSI;
  Storyboard *in_RDI;
  
  poVar1 = ::std::operator<<((ostream *)&in_RDI->field_0x10,in_RSI);
  poVar1 = ::std::operator<<(poVar1,": ");
  poVar1 = ::std::operator<<(poVar1,in_RDX);
  ::std::operator<<(poVar1,"\n");
  in_RDI->addNewLineBeforeNextFrame_ = true;
  return in_RDI;
}

Assistant:

Storyboard& Storyboard::addDescriptionWithData(const std::string& description,
                                                   const std::string& data)
    {
        output_ << description << ": " << data << "\n";
        addNewLineBeforeNextFrame_ = true;
        return *this;
    }